

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinImporter::ReadBinaryCamera(AssbinImporter *this,IOStream *stream,aiCamera *cam)

{
  uint uVar1;
  DeadlyImportError *this_00;
  float fVar2;
  aiVector3D aVar3;
  allocator<char> local_429;
  uint local_428;
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 == 0x1234) {
    Read<unsigned_int>(stream);
    Read<aiString>((aiString *)&stack0xfffffffffffffbd8,stream);
    if ((aiCamera *)&stack0xfffffffffffffbd8 != cam) {
      (cam->mName).length = local_428;
      memcpy((cam->mName).data,&stack0xfffffffffffffbdc,(ulong)local_428);
      (cam->mName).data[local_428] = '\0';
    }
    aVar3 = Read<aiVector3t<float>>(stream);
    cam->mPosition = aVar3;
    aVar3 = Read<aiVector3t<float>>(stream);
    cam->mLookAt = aVar3;
    aVar3 = Read<aiVector3t<float>>(stream);
    cam->mUp = aVar3;
    fVar2 = Read<float>(stream);
    cam->mHorizontalFOV = fVar2;
    fVar2 = Read<float>(stream);
    cam->mClipPlaneNear = fVar2;
    fVar2 = Read<float>(stream);
    cam->mClipPlaneFar = fVar2;
    fVar2 = Read<float>(stream);
    cam->mAspect = fVar2;
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffbd8,"Magic chunk identifiers are wrong!",&local_429);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&stack0xfffffffffffffbd8);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryCamera( IOStream * stream, aiCamera* cam ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AICAMERA)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    cam->mName = Read<aiString>(stream);
    cam->mPosition = Read<aiVector3D>(stream);
    cam->mLookAt = Read<aiVector3D>(stream);
    cam->mUp = Read<aiVector3D>(stream);
    cam->mHorizontalFOV = Read<float>(stream);
    cam->mClipPlaneNear = Read<float>(stream);
    cam->mClipPlaneFar = Read<float>(stream);
    cam->mAspect = Read<float>(stream);
}